

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Resize
          (TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int64_t newsize,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *object)

{
  int64_t *piVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  long lVar8;
  
  if (newsize < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ostream::flush();
    return;
  }
  lVar3 = this->fNElements;
  if (lVar3 != newsize) {
    if (newsize == 0) {
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      uVar4 = newsize << 5;
      piVar1 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3b != 0) | uVar4 | 8);
      *piVar1 = newsize;
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(piVar1 + 1);
      piVar1 = piVar1 + 3;
      do {
        piVar1[-2] = (int64_t)piVar1;
        piVar1[-1] = 0;
        *(undefined1 *)piVar1 = 0;
        piVar1 = piVar1 + 4;
        uVar4 = uVar4 - 0x20;
      } while (uVar4 != 0);
    }
    if (newsize <= lVar3) {
      lVar3 = newsize;
    }
    lVar5 = 0;
    lVar8 = lVar3;
    if (lVar3 < 1) {
      lVar3 = lVar5;
      lVar8 = lVar5;
    }
    while (lVar3 != 0) {
      std::__cxx11::string::_M_assign((string *)((long)&(pbVar7->_M_dataplus)._M_p + lVar5));
      lVar5 = lVar5 + 0x20;
      lVar3 = lVar3 + -1;
    }
    pbVar6 = pbVar7 + lVar8;
    for (; lVar8 < newsize; lVar8 = lVar8 + 1) {
      std::__cxx11::string::_M_assign((string *)pbVar6);
      pbVar6 = pbVar6 + 1;
    }
    pbVar6 = this->fStore;
    if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar3 = *(long *)((long)&pbVar6[-1].field_2 + 8);
      if (lVar3 != 0) {
        lVar8 = lVar3 << 5;
        do {
          std::__cxx11::string::~string((string *)((long)&pbVar6[-1]._M_dataplus._M_p + lVar8));
          lVar8 = lVar8 + -0x20;
        } while (lVar8 != 0);
      }
      operator_delete__((void *)((long)&pbVar6[-1].field_2 + 8),lVar3 << 5 | 8);
    }
    this->fStore = pbVar7;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}